

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O1

void __thiscall OutputRedirect::flush(OutputRedirect *this)

{
  int iVar1;
  int *piVar2;
  SystemError *this_00;
  
  do {
    iVar1 = fflush((FILE *)this->file_);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  fmt::SystemError::SystemError(this_00,*piVar2,(CStringRef)0x22a692);
  __cxa_throw(this_00,&fmt::SystemError::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void OutputRedirect::flush() {
#if EOF != -1
# error "FMT_RETRY assumes return value of -1 indicating failure"
#endif
  int result = 0;
  FMT_RETRY(result, fflush(file_));
  if (result != 0)
    throw fmt::SystemError(errno, "cannot flush stream");
}